

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O3

void __thiscall
entt::basic_registry<entt::entity>::pool_handler<Transform>::pool_handler
          (pool_handler<Transform> *this,pool_handler<Transform> *param_1)

{
  sparse_set<entt::entity>::sparse_set
            ((sparse_set<entt::entity> *)this,(sparse_set<entt::entity> *)param_1);
  (this->super_storage<entt::entity,_Transform>).super_basic_storage<entt::entity,_Transform,_void>.
  super_sparse_set<entt::entity>._vptr_sparse_set = (_func_int **)&PTR__basic_storage_007dd168;
  std::vector<Transform,_std::allocator<Transform>_>::vector
            (&(this->super_storage<entt::entity,_Transform>).
              super_basic_storage<entt::entity,_Transform,_void>.instances,
             &(param_1->super_storage<entt::entity,_Transform>).
              super_basic_storage<entt::entity,_Transform,_void>.instances);
  (this->super_storage<entt::entity,_Transform>).super_basic_storage<entt::entity,_Transform,_void>.
  super_sparse_set<entt::entity>._vptr_sparse_set = (_func_int **)&PTR__pool_handler_007dd0f8;
  this->group = param_1->group;
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>_>_>
  ::vector(&(this->construction).calls,&(param_1->construction).calls);
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>_>_>
  ::vector(&(this->update).calls,&(param_1->update).calls);
  std::
  vector<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>,_std::allocator<entt::delegate<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>_>_>
  ::vector(&(this->destruction).calls,&(param_1->destruction).calls);
  return;
}

Assistant:

pool_handler() ENTT_NOEXCEPT = default;